

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

void Cudd_SetTree(DdManager *dd,MtrNode *tree)

{
  if (dd->tree != (MtrNode *)0x0) {
    Mtr_FreeTree(dd->tree);
  }
  dd->tree = tree;
  if (tree != (MtrNode *)0x0) {
    fixVarTree(tree,dd->perm,dd->size);
    return;
  }
  return;
}

Assistant:

void
Cudd_SetTree(
  DdManager * dd,
  MtrNode * tree)
{
    if (dd->tree != NULL) {
        Mtr_FreeTree(dd->tree);
    }
    dd->tree = tree;
    if (tree == NULL) return;

    fixVarTree(tree, dd->perm, dd->size);
    return;

}